

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

UnlocalizedNumberFormatter *
icu_63::number::impl::skeleton::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,UnicodeString *skeletonString,
          UErrorCode *status)

{
  UnlocalizedNumberFormatter local_3a8;
  undefined1 local_1e0 [8];
  MacroProps macros;
  UErrorCode *status_local;
  UnicodeString *skeletonString_local;
  
  macros.locale._216_8_ = status;
  umtx_initOnce((UInitOnce *)&::(anonymous_namespace)::gNumberSkeletonsInitOnce,
                anon_unknown.dwarf_15583e::initNumberSkeletons,status);
  parseSkeleton((MacroProps *)local_1e0,skeletonString,(UErrorCode *)macros.locale._216_8_);
  NumberFormatter::with();
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,
             &local_3a8.super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>,
             (MacroProps *)local_1e0);
  UnlocalizedNumberFormatter::~UnlocalizedNumberFormatter(&local_3a8);
  MacroProps::~MacroProps((MacroProps *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter skeleton::create(const UnicodeString& skeletonString, UErrorCode& status) {
    umtx_initOnce(gNumberSkeletonsInitOnce, &initNumberSkeletons, status);
    MacroProps macros = parseSkeleton(skeletonString, status);
    return NumberFormatter::with().macros(macros);
}